

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitmapIndexBuilder.cpp
# Opt level: O2

void __thiscall BitmapIndexBuilder::BitmapIndexBuilder(BitmapIndexBuilder *this,IndexType ntype)

{
  allocator_type local_1;
  
  (this->super_IndexBuilder).ntype = ntype;
  (this->super_IndexBuilder)._vptr_IndexBuilder = (_func_int **)&PTR__BitmapIndexBuilder_002439d8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->raw_data,0x1000000,&local_1);
  return;
}

Assistant:

BitmapIndexBuilder::BitmapIndexBuilder(IndexType ntype)
    : IndexBuilder(ntype), raw_data(file_run_size * NUM_TRIGRAMS) {}